

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<char16_t>::SetNotRanges
          (CharSet<char16_t> *this,ArenaAllocator *allocator,int numSortedPairs,Char *sortedPairs)

{
  int local_2c;
  int i;
  Char *sortedPairs_local;
  int numSortedPairs_local;
  ArenaAllocator *allocator_local;
  CharSet<char16_t> *this_local;
  
  if (numSortedPairs == 0) {
    SetRange(this,allocator,L'\0',L'\xffff');
  }
  else {
    if (*sortedPairs != L'\0') {
      SetRange(this,allocator,L'\0',*sortedPairs + L'\xffff');
    }
    for (local_2c = 1; local_2c < numSortedPairs * 2 + -1; local_2c = local_2c + 2) {
      SetRange(this,allocator,sortedPairs[local_2c] + L'\x01',sortedPairs[local_2c + 1] + L'\xffff')
      ;
    }
    if (sortedPairs[numSortedPairs * 2 + -1] != L'\xffff') {
      SetRange(this,allocator,sortedPairs[numSortedPairs * 2 + -1] + L'\x01',L'\xffff');
    }
  }
  return;
}

Assistant:

void CharSet<char16>::SetNotRanges(ArenaAllocator* allocator, int numSortedPairs, const Char* sortedPairs)
    {
        if (numSortedPairs == 0)
            SetRange(allocator, MinChar, MaxChar);
        else
        {
            if (sortedPairs[0] != MinChar)
                SetRange(allocator, MinChar, sortedPairs[0] - 1);
            for (int i = 1; i < numSortedPairs * 2 - 1; i += 2)
                SetRange(allocator, sortedPairs[i] + 1, sortedPairs[i+1] - 1);
            if (sortedPairs[numSortedPairs * 2 - 1] != MaxChar)
                SetRange(allocator, sortedPairs[numSortedPairs * 2 - 1] + 1, MaxChar);
        }
    }